

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

duckdb_state
duckdb_register_aggregate_function_set
          (duckdb_connection connection,duckdb_aggregate_function_set function_set)

{
  LogicalType *pLVar1;
  bool bVar2;
  bool bVar3;
  duckdb_state dVar4;
  reference pvVar5;
  AggregateFunctionInfo *pAVar6;
  ClientContext *this;
  LogicalType *pLVar7;
  size_type __n;
  Connection *con;
  duckdb_connection local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  duckdb_connection local_48;
  duckdb_aggregate_function_set local_40;
  duckdb_aggregate_function_set local_38;
  
  dVar4 = DuckDBError;
  if (function_set != (duckdb_aggregate_function_set)0x0 && connection != (duckdb_connection)0x0) {
    local_48 = connection;
    if (*(long *)(function_set + 0x28) != *(long *)(function_set + 0x20)) {
      local_38 = function_set + 0x20;
      __n = 0;
      local_40 = function_set;
      do {
        pvVar5 = duckdb::vector<duckdb::AggregateFunction,_true>::operator[]
                           ((vector<duckdb::AggregateFunction,_true> *)local_38,__n);
        pAVar6 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                           (&pvVar5->function_info);
        if (((((pvVar5->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_string_length == 0) ||
             (pAVar6[3]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) ||
            (pAVar6[4]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) ||
           (pAVar6[5]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) {
          return DuckDBError;
        }
        pLVar7 = &(pvVar5->super_BaseScalarFunction).return_type;
        local_70 = (duckdb_connection)((ulong)local_70 & 0xffffffffffffff00);
        local_68._M_unused._M_object = &local_70;
        bVar2 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (pLVar7,(anon_class_8_1_50811320 *)&local_68);
        if (bVar2) {
          return DuckDBError;
        }
        local_70 = (duckdb_connection)CONCAT71(local_70._1_7_,3);
        local_68._M_unused._M_object = &local_70;
        bVar2 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (pLVar7,(anon_class_8_1_50811320 *)&local_68);
        if (bVar2) {
          return DuckDBError;
        }
        pLVar7 = (pvVar5->super_BaseScalarFunction).super_SimpleFunction.arguments.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar1 = *(pointer *)
                  ((long)&(pvVar5->super_BaseScalarFunction).super_SimpleFunction.arguments.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data + 8);
        bVar2 = pLVar7 == pLVar1;
        if (!bVar2) {
          local_70 = (duckdb_connection)((ulong)local_70 & 0xffffffffffffff00);
          local_68._M_unused._M_object = &local_70;
          bVar3 = duckdb::TypeVisitor::
                  Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                            (pLVar7,(anon_class_8_1_50811320 *)&local_68);
          while (!bVar3) {
            pLVar7 = pLVar7 + 1;
            bVar2 = pLVar7 == pLVar1;
            if (bVar2) goto LAB_01728ca9;
            local_70 = (duckdb_connection)((ulong)local_70 & 0xffffffffffffff00);
            local_68._M_unused._M_object = &local_70;
            bVar3 = duckdb::TypeVisitor::
                    Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                              (pLVar7,(anon_class_8_1_50811320 *)&local_68);
          }
          if (!bVar2) {
            return DuckDBError;
          }
        }
LAB_01728ca9:
        __n = __n + 1;
        function_set = local_40;
      } while (__n < (ulong)((*(long *)(local_40 + 0x28) - *(long *)(local_40 + 0x20) >> 4) *
                            -0x79435e50d79435e5));
    }
    local_70 = local_48;
    this = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)local_48);
    local_68._M_unused._M_object = &local_70;
    pcStack_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
               ::_M_manager;
    local_68._8_8_ = function_set;
    duckdb::ClientContext::RunFunctionInTransaction(this,(function<void_()> *)&local_68,true);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    dVar4 = DuckDBSuccess;
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_register_aggregate_function_set(duckdb_connection connection,
                                                    duckdb_aggregate_function_set function_set) {
	if (!connection || !function_set) {
		return DuckDBError;
	}
	auto &set = duckdb::GetCAggregateFunctionSet(function_set);
	for (idx_t idx = 0; idx < set.Size(); idx++) {
		auto &aggregate_function = set.GetFunctionReferenceByOffset(idx);
		auto &info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();

		if (aggregate_function.name.empty() || !info.update || !info.combine || !info.finalize) {
			return DuckDBError;
		}
		if (duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::INVALID) ||
		    duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::ANY)) {
			return DuckDBError;
		}
		for (const auto &argument : aggregate_function.arguments) {
			if (duckdb::TypeVisitor::Contains(argument, duckdb::LogicalTypeId::INVALID)) {
				return DuckDBError;
			}
		}
	}

	try {
		auto con = reinterpret_cast<duckdb::Connection *>(connection);
		con->context->RunFunctionInTransaction([&]() {
			auto &catalog = duckdb::Catalog::GetSystemCatalog(*con->context);
			duckdb::CreateAggregateFunctionInfo sf_info(set);
			catalog.CreateFunction(*con->context, sf_info);
		});
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}